

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O3

Var JSON::Stringify(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  RecyclableObject *aValue;
  RecyclableObject *space;
  RecyclableObject *this;
  RecyclableObject *pRVar9;
  undefined4 extraout_var;
  int in_stack_00000010;
  Type local_98;
  Type TStack_90;
  undefined1 local_88 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  Var result;
  Var local_48;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                       ,0x69,"(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                       "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b6057a;
    *puVar8 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_40 = (undefined1  [8])callInfo;
  Js::ArgumentReader::AdjustArguments((ArgumentReader *)auStack_40,(CallInfo *)&__tag.entry.next);
  pJVar3 = (((function->type).ptr)->javascriptLibrary).ptr;
  pSVar2 = (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_88,function,(CallInfo)__tag.entry.next,
             L"JSON.stringify",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                       ,0x6e,"(!(callInfo.Flags & Js::CallFlags_New))",
                       "!(callInfo.Flags & Js::CallFlags_New)");
    if (!bVar5) goto LAB_00b6057a;
    *puVar8 = 0;
  }
  if (((ulong)auStack_40 & 0xfffffe) != 0) {
    aValue = (RecyclableObject *)Js::Arguments::operator[]((Arguments *)auStack_40,1);
    if ((auStack_40._0_4_ & 0xffffff) < 3) {
      local_48 = (Var)0x0;
    }
    else {
      local_48 = Js::Arguments::operator[]((Arguments *)auStack_40,2);
    }
    if (((ulong)auStack_40 & 0xfffffc) == 0) {
      space = (pJVar3->super_JavascriptLibraryBase).nullValue.ptr;
    }
    else {
      space = (RecyclableObject *)Js::Arguments::operator[]((Arguments *)auStack_40,3);
    }
    pRVar9 = aValue;
    if (aValue == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00b6057a;
      *puVar8 = 0;
LAB_00b6039f:
      this = Js::UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00b6057a;
        *puVar8 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_HostDispatch) {
          pRVar9 = Js::VarTo<Js::RecyclableObject>(aValue);
          iVar6 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x56])(pRVar9);
          pRVar9 = (RecyclableObject *)CONCAT44(extraout_var,iVar6);
          if (pRVar9 == (RecyclableObject *)0x0) {
            pRVar9 = Js::VarTo<Js::RecyclableObject>(aValue);
            local_98._0_4_ = auStack_40._0_4_;
            local_98._4_4_ = auStack_40._4_4_;
            TStack_90._0_4_ = args.super_Arguments.Info._0_4_;
            TStack_90._4_4_ = args.super_Arguments.Info._4_4_;
            iVar6 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x55])
                              (pRVar9,Stringify,&local_98,&callInfo_local);
            pRVar9 = aValue;
            if (iVar6 != 0) goto LAB_00b604d5;
          }
          else {
            bVar5 = Js::VarIsImpl<Js::DynamicObject>(pRVar9);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                                 ,0x80,"(Js::VarIsCorrectType(remoteObject))",
                                 "Js::VarIsCorrectType(remoteObject)");
              if (!bVar5) goto LAB_00b6057a;
              goto LAB_00b604a8;
            }
          }
        }
      }
      else {
        BVar7 = Js::RecyclableObject::IsExternal(this);
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          goto LAB_00b604a0;
        }
      }
    }
    else if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
             ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)aValue >> 0x32 == 0 && ((ulong)aValue & 0xffff000000000000) != 0x1000000000000)
      goto LAB_00b6039f;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
LAB_00b604a0:
      if (bVar5 == false) {
LAB_00b6057a:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
LAB_00b604a8:
      *puVar8 = 0;
    }
    callInfo_local = (CallInfo)Js::JSONStringifier::Stringify(pSVar2,pRVar9,local_48,space);
    if (callInfo_local != (CallInfo)0x0) goto LAB_00b604d5;
  }
  callInfo_local = (CallInfo)(pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr;
LAB_00b604d5:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_88);
  return (Var)callInfo_local;
}

Assistant:

Js::Var Stringify(Js::RecyclableObject* function, Js::CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        //ES5: Stringify(value, [replacer][, space]])
        ARGUMENTS(args, callInfo);
        Js::JavascriptLibrary* library = function->GetType()->GetLibrary();
        Js::ScriptContext* scriptContext = library->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("JSON.stringify"));

        Assert(!(callInfo.Flags & Js::CallFlags_New));

        if (args.Info.Count < 2)
        {
            // if value is missing it is assumed to be 'undefined'.
            // shortcut: the stringify algorithm returns undefined in this case.
            return library->GetUndefined();
        }
        Js::Var value = args[1];
        Js::Var replacerArg = args.Info.Count > 2 ? args[2] : nullptr;
        Js::Var space = args.Info.Count > 3 ? args[3] : library->GetNull();

        if (Js::JavascriptOperators::GetTypeId(value) == Js::TypeIds_HostDispatch)
        {
            // If we a remote object, we need to pull out the underlying JS object to stringify that
            Js::DynamicObject* remoteObject = Js::VarTo<Js::RecyclableObject>(value)->GetRemoteObject();
            if (remoteObject != nullptr)
            {
                AssertOrFailFast(Js::VarIsCorrectType(remoteObject));
                value = remoteObject;
            }
            else
            {
                Js::Var result;
                if (Js::VarTo<Js::RecyclableObject>(value)->InvokeBuiltInOperationRemotely(Stringify, args, &result))
                {
                    return result;
                }
            }
        }

        LazyJSONString* lazy = JSONStringifier::Stringify(scriptContext, value, replacerArg, space);
        if (!lazy)
        {
            return library->GetUndefined();
        }
        return lazy;
    }